

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

wchar_t archive_read_disk_open_w(archive *_a,wchar_t *pathname)

{
  int iVar1;
  wchar_t wVar2;
  size_t len;
  int *piVar3;
  char *fmt;
  archive_string local_38;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x21,"archive_read_disk_open_w");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    archive_clear_error(_a);
    local_38.s = (char *)0x0;
    local_38.length = 0;
    local_38.buffer_length = 0;
    len = wcslen(pathname);
    wVar2 = archive_string_append_from_wcs(&local_38,pathname,len);
    if (wVar2 == L'\0') {
      wVar2 = _archive_read_disk_open(_a,local_38.s);
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        fmt = "Can\'t allocate memory";
        iVar1 = 0xc;
      }
      else {
        fmt = "Can\'t convert a path to a char string";
        iVar1 = -1;
      }
      archive_set_error(_a,iVar1,fmt);
      _a->state = 0x8000;
      wVar2 = L'\xffffffe2';
    }
    archive_string_free(&local_38);
  }
  return wVar2;
}

Assistant:

int
archive_read_disk_open_w(struct archive *_a, const wchar_t *pathname)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	struct archive_string path;
	int ret;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_NEW | ARCHIVE_STATE_CLOSED,
	    "archive_read_disk_open_w");
	archive_clear_error(&a->archive);

	/* Make a char string from a wchar_t string. */
	archive_string_init(&path);
	if (archive_string_append_from_wcs(&path, pathname,
	    wcslen(pathname)) != 0) {
		if (errno == ENOMEM)
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
		else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't convert a path to a char string");
		a->archive.state = ARCHIVE_STATE_FATAL;
		ret = ARCHIVE_FATAL;
	} else
		ret = _archive_read_disk_open(_a, path.s);

	archive_string_free(&path);
	return (ret);
}